

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

int Abc_SclComputeParametersPin(SC_Lib *p,SC_Cell *pCell,int iPin,float Slew,float *pLD,float *pPD)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  SC_Timing *pTime;
  float *pfVar4;
  int iVar5;
  float fVar6;
  SC_Pair SlewOut;
  SC_Pair ArrIn;
  SC_Pair SlewIn;
  SC_Pair Load2;
  SC_Pair Load1;
  SC_Pair local_88;
  SC_Pair local_80;
  SC_Pair local_78;
  SC_Pair local_70;
  SC_Pair local_68;
  float local_60;
  float local_5c;
  SC_Pair local_58;
  float *local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  local_68.rise = 0.0;
  local_68.fall = 0.0;
  local_70.rise = 0.0;
  local_70.fall = 0.0;
  local_78.rise = 0.0;
  local_78.fall = 0.0;
  local_80.rise = 0.0;
  local_80.fall = 0.0;
  local_88.rise = 0.0;
  local_88.fall = 0.0;
  local_58.rise = Slew;
  local_58.fall = Slew;
  if (-1 < iPin) {
    uVar1 = pCell->n_inputs;
    if (iPin < (int)uVar1) {
      if ((pCell->vPins).nSize <= (int)uVar1) goto LAB_004711b7;
      pvVar2 = (pCell->vPins).pArray[uVar1];
      if (*(uint *)((long)pvVar2 + 0x44) != uVar1) {
        __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                      ,0x292,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
      }
      lVar3 = *(long *)(*(long *)((long)pvVar2 + 0x48) + (ulong)(uint)iPin * 8);
      iVar5 = *(int *)(lVar3 + 0xc);
      if (iVar5 != 0) {
        if (iVar5 != 1) {
          __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                        ,0x296,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
        }
        pTime = (SC_Timing *)**(undefined8 **)(lVar3 + 0x10);
        if (pTime == (SC_Timing *)0x0) {
          iVar5 = 0;
        }
        else {
          uVar1 = (pTime->pCellRise).vIndex1.nSize;
          if ((ulong)uVar1 == 1) {
            *pLD = 0.0;
            if ((pTime->pCellRise).vData.nSize < 1) {
LAB_004711b7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar2 = *(pTime->pCellRise).vData.pArray;
            if (*(int *)((long)pvVar2 + 4) < 1) goto LAB_00471214;
            fVar6 = **(float **)((long)pvVar2 + 8);
          }
          else {
            local_48.rise = 0.0;
            local_48.fall = 0.0;
            local_50 = pPD;
            if ((int)uVar1 < 1) {
LAB_00471214:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                            ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
            }
            pfVar4 = (pTime->pCellRise).vIndex1.pArray;
            local_60 = *pfVar4;
            local_5c = pfVar4[(ulong)uVar1 - 2];
            local_40.rise = local_5c;
            local_40.fall = local_5c;
            local_38.rise = local_60;
            local_38.fall = local_60;
            Scl_LibPinArrival(pTime,&local_68,&local_58,&local_48,&local_70,&local_88);
            Scl_LibPinArrival(pTime,&local_68,&local_58,&local_38,&local_78,&local_88);
            Scl_LibPinArrival(pTime,&local_68,&local_58,&local_40,&local_80,&local_88);
            if ((pCell->vPins).nSize <= iPin) goto LAB_004711b7;
            fVar6 = local_70.rise * 0.5 + local_70.fall * 0.5;
            pvVar2 = (pCell->vPins).pArray[(uint)iPin];
            *pLD = ((local_80.rise * 0.5 + local_80.fall * 0.5) -
                   (local_78.rise * 0.5 + local_78.fall * 0.5)) /
                   ((local_5c - local_60) /
                   (*(float *)((long)pvVar2 + 0x10) * 0.5 + *(float *)((long)pvVar2 + 0x14) * 0.5));
            pPD = local_50;
          }
          *pPD = fVar6;
          iVar5 = 1;
        }
      }
      return iVar5;
    }
  }
  __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
}

Assistant:

int Abc_SclComputeParametersPin( SC_Lib * p, SC_Cell * pCell, int iPin, float Slew, float * pLD, float * pPD )
{
    SC_Pair Load0, Load1, Load2;
    SC_Pair ArrIn  = { 0.0, 0.0 };
    SC_Pair SlewIn = { Slew, Slew };
    SC_Pair ArrOut0 = { 0.0, 0.0 };
    SC_Pair ArrOut1 = { 0.0, 0.0 };
    SC_Pair ArrOut2 = { 0.0, 0.0 };
    SC_Pair SlewOut = { 0.0, 0.0 };
    SC_Timing * pTime = Scl_CellPinTime( pCell, iPin );
    Vec_Flt_t * vIndex = pTime ? &pTime->pCellRise.vIndex1 : NULL; // capacitance
    if ( vIndex == NULL )
        return 0;
    // handle constant table
    if ( Vec_FltSize(vIndex) == 1 )
    {
        *pLD = 0;
        *pPD = Vec_FltEntry( (Vec_Flt_t *)Vec_PtrEntry(&pTime->pCellRise.vData, 0), 0 );
        return 1;
    }
    // get load points
    Load0.rise = Load0.fall = 0.0;
    Load1.rise = Load1.fall = Vec_FltEntry( vIndex, 0 );
    Load2.rise = Load2.fall = Vec_FltEntry( vIndex, Vec_FltSize(vIndex) - 2 );
    // compute delay
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load0, &ArrOut0, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load1, &ArrOut1, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load2, &ArrOut2, &SlewOut );
    ArrOut0.rise = 0.5 * ArrOut0.rise + 0.5 * ArrOut0.fall;
    ArrOut1.rise = 0.5 * ArrOut1.rise + 0.5 * ArrOut1.fall;
    ArrOut2.rise = 0.5 * ArrOut2.rise + 0.5 * ArrOut2.fall;
    // get tangent
    *pLD = (ArrOut2.rise - ArrOut1.rise) / ((Load2.rise - Load1.rise) / SC_CellPinCap(pCell, iPin));
    // get constant
    *pPD = ArrOut0.rise;
    return 1;
}